

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O3

Ref trun::TestRunner::GetCurrentTestModule(void)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  long *in_FS_OFFSET;
  Ref RVar2;
  
  lVar1 = *in_FS_OFFSET;
  if (*(char *)(lVar1 + -0x30) == '\0') {
    GetCurrentTestModule();
    in_RDX._M_pi = extraout_RDX;
  }
  in_RDI->_vptr_TestModule = *(_func_int ***)(lVar1 + -0x48);
  lVar1 = *(long *)(lVar1 + -0x40);
  *(long *)&in_RDI->state = lVar1;
  if (lVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    }
  }
  RVar2.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  RVar2.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ref)RVar2.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestModule::Ref TestRunner::GetCurrentTestModule() {
    return threadContext.currentTestModule;
}